

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O0

void __thiscall wasm::GenerateDynCalls::visitTable(GenerateDynCalls *this,Table *table)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  pointer this_00;
  pointer this_01;
  Module **in_RCX;
  anon_class_16_2_3fe77c5f visitor;
  undefined1 local_68 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> tableSegmentData;
  __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
  local_30;
  __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
  it;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *segments;
  Module *wasm;
  Table *table_local;
  GenerateDynCalls *this_local;
  
  wasm = (Module *)table;
  table_local = (Table *)this;
  segments = (vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              *)Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>::
                getModule(&(this->
                           super_WalkerPass<wasm::PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>_>
                           ).
                           super_PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>
                           .
                           super_Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>
                         );
  it._M_current =
       (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
       &((Module *)segments)->elementSegments;
  __first = std::
            vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ::begin((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                     *)it._M_current);
  __last = std::
           vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ::end((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                  *)it._M_current);
  local_30 = std::
             find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>*,std::vector<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>,std::allocator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>>>>,wasm::GenerateDynCalls::visitTable(wasm::Table*)::_lambda(std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>&)_1_>
                       ((__normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                         )__first._M_current,
                        (__normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                         )__last._M_current,(anon_class_8_1_a8aa2aee_for__M_pred)&wasm);
  tableSegmentData.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                ::end((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                       *)it._M_current);
  bVar1 = __gnu_cxx::operator!=
                    (&local_30,
                     (__normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                      *)&tableSegmentData.
                         super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_68);
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
              ::operator->(&local_30);
    this_01 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::get
                        (this_00);
    visitor.wasm = in_RCX;
    visitor.this = (GenerateDynCalls *)&segments;
    ElementUtils::
    iterElementSegmentFunctionNames<wasm::GenerateDynCalls::visitTable(wasm::Table*)::_lambda(wasm::Name,unsigned_int)_1_>
              ((ElementUtils *)this_01,(ElementSegment *)this,visitor);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_68);
  }
  return;
}

Assistant:

void visitTable(Table* table) {
    // Generate dynCalls for functions in the table
    Module* wasm = getModule();
    auto& segments = wasm->elementSegments;

    // Find a single elem segment for the table. We only care about one, since
    // wasm-ld emits only one table with a single segment.
    auto it = std::find_if(segments.begin(),
                           segments.end(),
                           [&](std::unique_ptr<ElementSegment>& segment) {
                             return segment->table == table->name;
                           });
    if (it != segments.end()) {
      std::vector<Name> tableSegmentData;
      ElementUtils::iterElementSegmentFunctionNames(
        it->get(), [&](Name name, Index) {
          generateDynCallThunk(wasm->getFunction(name)->type);
        });
    }
  }